

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O0

void __thiscall Fl_Browser::text(Fl_Browser *this,int line,char *newtext)

{
  FL_BLINE *a;
  size_t sVar1;
  FL_BLINE *n;
  FL_BLINE *pFStack_28;
  int l;
  FL_BLINE *t;
  char *newtext_local;
  int line_local;
  Fl_Browser *this_local;
  
  if ((0 < line) && (line <= this->lines)) {
    a = find_line(this,line);
    t = (FL_BLINE *)newtext;
    if (newtext == (char *)0x0) {
      t = (FL_BLINE *)0x28311c;
    }
    sVar1 = strlen((char *)t);
    pFStack_28 = a;
    if ((int)a->length < (int)sVar1) {
      pFStack_28 = (FL_BLINE *)malloc((long)(int)sVar1 + 0x28);
      Fl_Browser_::replacing(&this->super_Fl_Browser_,a,pFStack_28);
      this->cache = pFStack_28;
      pFStack_28->data = a->data;
      pFStack_28->icon = a->icon;
      pFStack_28->length = (short)sVar1;
      pFStack_28->flags = a->flags;
      pFStack_28->prev = a->prev;
      if (pFStack_28->prev == (FL_BLINE *)0x0) {
        this->first = pFStack_28;
      }
      else {
        pFStack_28->prev->next = pFStack_28;
      }
      pFStack_28->next = a->next;
      if (pFStack_28->next == (FL_BLINE *)0x0) {
        this->last = pFStack_28;
      }
      else {
        pFStack_28->next->prev = pFStack_28;
      }
      free(a);
    }
    strcpy(pFStack_28->txt,(char *)t);
    Fl_Browser_::redraw_line(&this->super_Fl_Browser_,pFStack_28);
  }
  return;
}

Assistant:

void Fl_Browser::text(int line, const char* newtext) {
  if (line < 1 || line > lines) return;
  FL_BLINE* t = find_line(line);
  if (!newtext) newtext = "";		// STR #3269
  int l = (int) strlen(newtext);
  if (l > t->length) {
    FL_BLINE* n = (FL_BLINE*)malloc(sizeof(FL_BLINE)+l);
    replacing(t, n);
    cache = n;
    n->data = t->data;
    n->icon = t->icon;
    n->length = (short)l;
    n->flags = t->flags;
    n->prev = t->prev;
    if (n->prev) n->prev->next = n; else first = n;
    n->next = t->next;
    if (n->next) n->next->prev = n; else last = n;
    free(t);
    t = n;
  }
  strcpy(t->txt, newtext);
  redraw_line(t);
}